

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O2

bool __thiscall Minisat::SimpSolver::merge(SimpSolver *this,Clause *_ps,Clause *_qs,Var v,int *size)

{
  anon_struct_4_5_613047fb_for_header aVar1;
  long lVar2;
  int iVar3;
  anon_struct_4_5_613047fb_for_header *paVar4;
  ulong uVar5;
  int iVar6;
  int j;
  ulong uVar7;
  
  this->merges = this->merges + 1;
  paVar4 = &_qs->header;
  aVar1 = _ps->header;
  if ((uint)_ps->header >> 5 < (uint)_qs->header >> 5) {
    paVar4 = &_ps->header;
    aVar1 = _qs->header;
    _ps = _qs;
  }
  iVar3 = ((uint)aVar1 >> 5) - 1;
  *size = iVar3;
  for (uVar5 = 0; uVar5 < (uint)*paVar4 >> 5; uVar5 = uVar5 + 1) {
    iVar6 = (int)paVar4[uVar5 + 1] >> 1;
    if (iVar6 != v) {
      uVar7 = 0;
      do {
        if ((uint)_ps->header >> 5 == uVar7) {
          iVar3 = iVar3 + 1;
          *size = iVar3;
          goto LAB_00110144;
        }
        lVar2 = uVar7 + 1;
        uVar7 = uVar7 + 1;
      } while ((int)(&_ps->header)[lVar2] >> 1 != iVar6);
      if (((uint)(&_ps->header)[lVar2] ^ (uint)paVar4[uVar5 + 1]) == 1) break;
    }
LAB_00110144:
  }
  return (uint)*paVar4 >> 5 <= uVar5;
}

Assistant:

bool SimpSolver::merge(const Clause& _ps, const Clause& _qs, Var v, int& size)
{
    merges++;

    bool  ps_smallest = _ps.size() < _qs.size();
    const Clause& ps  =  ps_smallest ? _qs : _ps;
    const Clause& qs  =  ps_smallest ? _ps : _qs;
    const Lit*  __ps  = (const Lit*)ps;
    const Lit*  __qs  = (const Lit*)qs;

    size = ps.size()-1;

    for (int i = 0; i < qs.size(); i++){
        if (var(__qs[i]) != v){
            for (int j = 0; j < ps.size(); j++)
                if (var(__ps[j]) == var(__qs[i])){
                    if (__ps[j] == ~__qs[i])
                        return false;
                    else
                        goto next;
                }
            size++;
        }
        next:;
    }

    return true;
}